

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O2

void __thiscall
solitaire::SolitaireHandWithOneCardAddCardTest_addCardOnFoundationPileWithHistoryRecord_Test::
TestBody(SolitaireHandWithOneCardAddCardTest_addCardOnFoundationPileWithHistoryRecord_Test *this)

{
  StrictSnapshotMockPtr *snapshot;
  HistoryTrackerMock *this_00;
  TypedExpectation<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  *this_01;
  Cards *pCVar1;
  Solitaire *this_02;
  char *in_R9;
  InSequence seq;
  undefined1 local_78 [8];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  _Head_base<0UL,_testing::StrictMock<solitaire::archivers::SnapshotMock>_*,_false> local_68;
  AssertHelper local_60;
  AssertionResult gtest_ar_;
  undefined1 local_40 [32];
  optional<solitaire::cards::Card> cardToAdd;
  PileId local_14;
  
  cardToAdd.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
  super__Optional_payload_base<solitaire::cards::Card>._M_payload =
       *(_Storage<solitaire::cards::Card,_true> *)((anonymous_namespace)::oneCard._8_8_ + -8);
  cardToAdd.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
  super__Optional_payload_base<solitaire::cards::Card>._M_engaged = true;
  testing::InSequence::InSequence(&seq);
  snapshot = &(this->super_SolitaireHandWithOneCardAddCardTest).snapshotMock2;
  SolitaireEmptyHandTest::expectSnapshotCreation<solitaire::piles::FoundationPileMock>
            ((SolitaireEmptyHandTest *)this,
             (this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
             super_SolitaireEmptyHandTest.super_SolitaireTest.lastFoundationPileMock,snapshot);
  SolitaireEmptyHandTest::expectTryingAddCardAndClearIt<solitaire::piles::FoundationPileMock>
            ((SolitaireEmptyHandTest *)this,
             (this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
             super_SolitaireEmptyHandTest.super_SolitaireTest.lastFoundationPileMock,&cardToAdd);
  this_01 = SolitaireEmptyHandTest::expectMoveOperationSnapshotCreation
                      ((SolitaireEmptyHandTest *)this,snapshot);
  mock_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>_>::make_unique
            ((mock_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>_> *)local_78);
  local_68._M_head_impl = (StrictMock<solitaire::archivers::SnapshotMock> *)local_78;
  local_78 = (undefined1  [8])0x0;
  testing::
  Return<testing::internal::ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>>>>>
            ((testing *)&gtest_ar_,
             (ByMoveWrapper<std::unique_ptr<testing::StrictMock<solitaire::archivers::SnapshotMock>,_std::default_delete<testing::StrictMock<solitaire::archivers::SnapshotMock>_>_>_>
              *)&local_68);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
              *)local_40,(ReturnAction *)&gtest_ar_);
  testing::internal::
  TypedExpectation<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::WillOnce(this_01,(Action<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
                      *)local_40);
  std::_Function_base::~_Function_base((_Function_base *)local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_.message_);
  if (local_68._M_head_impl != (StrictMock<solitaire::archivers::SnapshotMock> *)0x0) {
    (*((local_68._M_head_impl)->super_SnapshotMock).super_Snapshot._vptr_Snapshot[1])();
  }
  local_68._M_head_impl = (StrictMock<solitaire::archivers::SnapshotMock> *)0x0;
  if (local_78 != (undefined1  [8])0x0) {
    (*(((SnapshotMock *)local_78)->super_Snapshot)._vptr_Snapshot[1])();
  }
  local_78 = (undefined1  [8])0x0;
  this_00 = &((this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
              super_SolitaireEmptyHandTest.super_SolitaireTest.historyTrackerMock.rawPointer)->
             super_HistoryTrackerMock;
  local_70._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (this->super_SolitaireHandWithOneCardAddCardTest).moveOperationSnapshot.rawPointer;
  testing::internal::PointerMatcher::operator_cast_to_Matcher
            ((Matcher<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
              *)&gtest_ar_,(PointerMatcher *)&local_70);
  archivers::HistoryTrackerMock::gmock_save
            ((MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
              *)local_40,this_00,
             (Matcher<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
              *)&gtest_ar_);
  testing::internal::GetWithoutMatchers();
  testing::internal::
  MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
  ::InternalExpectedAt
            ((MockSpec<void_(std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>)>
              *)local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
             ,0x1f1,"*historyTrackerMock","save(Pointer(moveOperationSnapshot.get()))");
  testing::internal::
  MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  ::~MatcherBase((MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
                  *)(local_40 + 8));
  testing::internal::
  MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
  ::~MatcherBase((MatcherBase<std::unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>_>
                  *)&gtest_ar_);
  this_02 = &(this->super_SolitaireHandWithOneCardAddCardTest).super_SolitaireHandWithOneCardTest.
             super_SolitaireEmptyHandTest.super_SolitaireTest.solitaire;
  local_14.t = (anonymous_namespace)::lastFoundationPileId;
  Solitaire::tryAddCardOnFoundationPile(this_02,&local_14);
  pCVar1 = Solitaire::getCardsInHand(this_02);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (pCVar1->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)
       ._M_impl.super__Vector_impl_data._M_start ==
       (pCVar1->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>)
       ._M_impl.super__Vector_impl_data._M_finish;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&gtest_ar_,
               (AssertionResult *)"solitaire.getCardsInHand().empty()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,500,(char *)local_40._0_8_);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)local_40);
    if (local_70._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  testing::InSequence::~InSequence(&seq);
  return;
}

Assistant:

TEST_F(SolitaireHandWithOneCardAddCardTest, addCardOnFoundationPileWithHistoryRecord) {
    std::optional<Card> cardToAdd {oneCard.back()};

    InSequence seq;
    expectSnapshotCreation(lastFoundationPileMock, snapshotMock2);
    expectTryingAddCardAndClearIt(lastFoundationPileMock, cardToAdd);
    expectMoveOperationSnapshotCreation(snapshotMock2)
        .WillOnce(Return(ByMove(moveOperationSnapshot.make_unique())));
    EXPECT_CALL(*historyTrackerMock, save(Pointer(moveOperationSnapshot.get())));

    solitaire.tryAddCardOnFoundationPile(lastFoundationPileId);
    EXPECT_TRUE(solitaire.getCardsInHand().empty());
}